

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cc
# Opt level: O0

void xemmai::anon_unknown_18::f_method_bind(t_pvalue *a_stack)

{
  t_object *this;
  t_type *ptVar1;
  size_t a_n;
  size_t n;
  t_object *p;
  t_pvalue *a_stack_local;
  
  t_value<xemmai::t_pointer>::operator=(a_stack + 2,a_stack + 1);
  this = t_pointer::operator_cast_to_t_object_(&a_stack->super_t_pointer);
  ptVar1 = t_object::f_type(this);
  a_n = (*ptVar1->f_get_at)(this,a_stack);
  if (a_n != 0xffffffffffffffff) {
    f_loop(a_stack,a_n);
  }
  t_pointer::operator=(&a_stack[1].super_t_pointer,(t_object *)0x0);
  return;
}

Assistant:

void f_method_bind(t_pvalue* a_stack)
{
	a_stack[2] = a_stack[1];
	auto p = static_cast<t_object*>(a_stack[0]);
	size_t n = p->f_type()->f_get_at(p, a_stack);
	if (n != size_t(-1)) f_loop(a_stack, n);
	a_stack[1] = nullptr;
}